

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O3

string * __thiscall
duckdb::ParsedExtensionMetaData::GetInvalidMetadataError_abi_cxx11_
          (string *__return_storage_ptr__,ParsedExtensionMetaData *this)

{
  ExtensionABIType EVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  InternalException *this_00;
  _Alloc_hider _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *pcVar6;
  string engine_version;
  idx_t patch;
  idx_t minor;
  idx_t major;
  string engine_platform;
  int in_stack_fffffffffffffdd8;
  string local_220;
  idx_t local_200;
  ulong local_1f8;
  string local_1f0;
  undefined1 *local_1d0;
  size_t local_1c8;
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  string local_170;
  char *local_150 [2];
  char local_140 [16];
  string local_130;
  char *local_110 [2];
  char local_100 [16];
  string local_f0;
  char *local_d0 [2];
  char local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  DuckDB::Platform_abi_cxx11_();
  iVar4 = ::std::__cxx11::string::compare((char *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (iVar4 != 0) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "The file is not a DuckDB extension. The metadata at the end of the file is invalid",
               "");
    goto LAB_0165e6c3;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  EVar1 = this->abi_type;
  if (EVar1 == C_STRUCT_UNSTABLE) {
LAB_0165e20c:
    ExtensionHelper::GetVersionDirectoryName_abi_cxx11_();
    _Var5._M_p = local_220._M_dataplus._M_p;
    if ((local_220._M_string_length != (this->duckdb_version)._M_string_length) ||
       ((local_220._M_string_length != 0 &&
        (iVar4 = bcmp(local_220._M_dataplus._M_p,(this->duckdb_version)._M_dataplus._M_p,
                      local_220._M_string_length), iVar4 != 0)))) {
      local_90[0] = local_80;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,
                 "The file was built specifically for DuckDB version \'%s\' and can only be loaded with that version of DuckDB. (this version of DuckDB is \'%s\')"
                 ,"");
      PrettyPrintString(&local_50,&this->duckdb_version);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_220._M_dataplus._M_p,
                 local_220._M_dataplus._M_p + local_220._M_string_length);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                (&local_1f0,(StringUtil *)local_90,&local_50,&local_b0,in_R8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_1f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      _Var5._M_p = local_220._M_dataplus._M_p;
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
        _Var5._M_p = local_220._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != &local_220.field_2) {
LAB_0165e59c:
      operator_delete(_Var5._M_p);
    }
  }
  else {
    if (EVar1 != C_STRUCT) {
      if (EVar1 != CPP) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::operator+(&local_220,"Unknown ABI type for extension: ",&this->extension_abi_metadata
                        );
        InternalException::InternalException(this_00,(string *)&local_220);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_0165e20c;
    }
    bVar3 = VersioningUtils::ParseSemver
                      ((VersioningUtils *)&this->duckdb_capi_version,&local_1f0,&local_1f8,
                       &local_200,(idx_t *)in_R8);
    if (!bVar3) {
      pcVar6 = local_c0;
      local_d0[0] = pcVar6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,
                 "The file was built for DuckDB C API version \'%s\', which failed to parse as a recognized version string"
                 ,"");
      pcVar2 = (this->duckdb_capi_version)._M_dataplus._M_p;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar2,pcVar2 + (this->duckdb_capi_version)._M_string_length);
      StringUtil::Format<std::__cxx11::string,int>
                ((string *)&local_220,(StringUtil *)local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001,
                 (int)in_R8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      _Var5._M_p = local_d0[0];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
        _Var5._M_p = local_d0[0];
      }
LAB_0165e597:
      if (_Var5._M_p == pcVar6) goto LAB_0165e5a1;
      goto LAB_0165e59c;
    }
    if (local_1f0._M_dataplus._M_p != &DAT_00000001) {
      pcVar6 = local_100;
      local_110[0] = pcVar6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_110,
                 "The file was built for DuckDB C API version \'%s\', but we can only load extensions built for DuckDB C API \'v%lld.x.y\'."
                 ,"");
      pcVar2 = (this->duckdb_capi_version)._M_dataplus._M_p;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,pcVar2,pcVar2 + (this->duckdb_capi_version)._M_string_length);
      StringUtil::Format<std::__cxx11::string,int>
                ((string *)&local_220,(StringUtil *)local_110,&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001,
                 (int)in_R8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      _Var5._M_p = local_110[0];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
        _Var5._M_p = local_110[0];
      }
      goto LAB_0165e597;
    }
    if ((2 < local_1f8) || ((local_1f8 == 2 && (local_200 != 0)))) {
      pcVar6 = local_140;
      local_150[0] = pcVar6;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,
                 "The file was built for DuckDB C API version \'%s\', but we can only load extensions built for DuckDB C API \'v%lld.%lld.%lld\' and lower."
                 ,"");
      pcVar2 = (this->duckdb_capi_version)._M_dataplus._M_p;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar2,pcVar2 + (this->duckdb_capi_version)._M_string_length);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      StringUtil::Format<std::__cxx11::string,int,int,int>
                (&local_220,(StringUtil *)local_150,&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001,
                 2,0,in_stack_fffffffffffffdd8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_220._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      _Var5._M_p = local_150[0];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
        _Var5._M_p = local_150[0];
      }
      goto LAB_0165e597;
    }
  }
LAB_0165e5a1:
  if ((local_1c8 != (this->platform)._M_string_length) ||
     ((local_1c8 != 0 &&
      (iVar4 = bcmp(local_1d0,(this->platform)._M_dataplus._M_p,local_1c8), iVar4 != 0)))) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_190[0] = local_180;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,
               "he file was built for the platform \'%s\', but we can only load extensions built for platform \'%s\'."
               ,"");
    PrettyPrintString(&local_70,&this->platform);
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_1d0,local_1d0 + local_1c8);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_220,(StringUtil *)local_190,&local_70,&local_1b0,in_R8);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_220._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
  }
LAB_0165e6c3:
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  return __return_storage_ptr__;
}

Assistant:

string ParsedExtensionMetaData::GetInvalidMetadataError() {
	const string engine_platform = string(DuckDB::Platform());

	if (!AppearsValid()) {
		return "The file is not a DuckDB extension. The metadata at the end of the file is invalid";
	}

	string result;

	// CPP or C_STRUCT_UNSTABLE ABI versioning needs to match the DuckDB version exactly
	if (abi_type == ExtensionABIType::CPP || abi_type == ExtensionABIType::C_STRUCT_UNSTABLE) {
		const string engine_version = string(ExtensionHelper::GetVersionDirectoryName());

		if (engine_version != duckdb_version) {
			result += StringUtil::Format("The file was built specifically for DuckDB version '%s' and can only be "
			                             "loaded with that version of DuckDB. (this version of DuckDB is '%s')",
			                             PrettyPrintString(duckdb_version), engine_version);
		}
		// C_STRUCT ABI versioning
	} else if (abi_type == ExtensionABIType::C_STRUCT) {
		idx_t major, minor, patch;
		if (!VersioningUtils::ParseSemver(duckdb_capi_version, major, minor, patch)) {
			result += StringUtil::Format("The file was built for DuckDB C API version '%s', which failed to parse as a "
			                             "recognized version string",
			                             duckdb_capi_version, DUCKDB_EXTENSION_API_VERSION_MAJOR);
		} else if (major != DUCKDB_EXTENSION_API_VERSION_MAJOR) {
			// Special case where the extension is built for a completely unsupported API
			result +=
			    StringUtil::Format("The file was built for DuckDB C API version '%s', but we can only load extensions "
			                       "built for DuckDB C API 'v%lld.x.y'.",
			                       duckdb_capi_version, DUCKDB_EXTENSION_API_VERSION_MAJOR);
		} else if (!VersioningUtils::IsSupportedCAPIVersion(major, minor, patch)) {
			result +=
			    StringUtil::Format("The file was built for DuckDB C API version '%s', but we can only load extensions "
			                       "built for DuckDB C API 'v%lld.%lld.%lld' and lower.",
			                       duckdb_capi_version, DUCKDB_EXTENSION_API_VERSION_MAJOR,
			                       DUCKDB_EXTENSION_API_VERSION_MINOR, DUCKDB_EXTENSION_API_VERSION_PATCH);
		}
	} else {
		throw InternalException("Unknown ABI type for extension: " + extension_abi_metadata);
	}

	if (engine_platform != platform) {
		if (!result.empty()) {
			result += " Also, t";
		} else {
			result += "T";
		}
		result += StringUtil::Format(
		    "he file was built for the platform '%s', but we can only load extensions built for platform '%s'.",
		    PrettyPrintString(platform), engine_platform);
	}

	return result;
}